

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decode.c
# Opt level: O2

uint32_t direct_get_fs(aec_stream_conflict *strm)

{
  internal_state_conflict *piVar1;
  byte *pbVar2;
  long lVar3;
  int iVar4;
  int iVar5;
  ulong uVar6;
  
  piVar1 = strm->state;
  iVar5 = piVar1->bitp;
  if (iVar5 == 0) {
    piVar1->acc = 0;
    uVar6 = 0;
  }
  else {
    uVar6 = (piVar1->acc << (-(char)iVar5 & 0x3fU)) >> (-(char)iVar5 & 0x3fU);
    piVar1->acc = uVar6;
  }
  iVar4 = 0;
  while (uVar6 == 0) {
    pbVar2 = strm->next_in;
    uVar6 = (ulong)pbVar2[6] |
            (ulong)pbVar2[5] << 8 |
            (ulong)pbVar2[4] << 0x10 |
            (ulong)pbVar2[3] << 0x18 |
            (ulong)pbVar2[2] << 0x20 | (ulong)pbVar2[1] << 0x28 | (ulong)*pbVar2 << 0x30;
    piVar1->acc = uVar6;
    strm->next_in = pbVar2 + 7;
    strm->avail_in = strm->avail_in - 7;
    iVar4 = iVar4 + iVar5;
    piVar1->bitp = 0x38;
    iVar5 = 0x38;
  }
  lVar3 = 0x3f;
  if (uVar6 != 0) {
    for (; uVar6 >> lVar3 == 0; lVar3 = lVar3 + -1) {
    }
  }
  piVar1->bitp = (uint)lVar3;
  return (iVar5 + iVar4 + ((uint)lVar3 ^ 0x3f)) - 0x40;
}

Assistant:

static inline uint32_t direct_get_fs(struct aec_stream *strm)
{
    /**
       Interpret a Fundamental Sequence from the input buffer.

       Essentially counts the number of 0 bits until a 1 is
       encountered.
     */

    uint32_t fs = 0;
#if HAVE_BSR64
    unsigned long i;
#else
    int i;
#endif
    struct internal_state *state = strm->state;

    if (state->bitp)
        state->acc &= UINT64_MAX >> (64 - state->bitp);
    else
        state->acc = 0;

    while (state->acc == 0) {
        state->acc = (state->acc << 56)
            | ((uint64_t)strm->next_in[0] << 48)
            | ((uint64_t)strm->next_in[1] << 40)
            | ((uint64_t)strm->next_in[2] << 32)
            | ((uint64_t)strm->next_in[3] << 24)
            | ((uint64_t)strm->next_in[4] << 16)
            | ((uint64_t)strm->next_in[5] << 8)
            | (uint64_t)strm->next_in[6];
        strm->next_in += 7;
        strm->avail_in -= 7;
        fs += state->bitp;
        state->bitp = 56;
    }

#ifndef __has_builtin
#define __has_builtin(x) 0  /* Compatibility with non-clang compilers. */
#endif
#if HAVE_DECL___BUILTIN_CLZLL || __has_builtin(__builtin_clzll)
    i = 63 - __builtin_clzll(state->acc);
#elif HAVE_BSR64
    _BitScanReverse64(&i, state->acc);
#else
    i = state->bitp - 1;
    while ((state->acc & (UINT64_C(1) << i)) == 0)
        i--;
#endif
    fs += state->bitp - i - 1;
    state->bitp = i;
    return fs;
}